

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O1

Machine * unifyValue(Machine *__return_storage_ptr__,Machine *m,Register r)

{
  _Rb_tree_header *p_Var1;
  undefined1 auVar2 [12];
  Hix HVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  Addr a2;
  Machine local_118;
  Machine local_a8;
  key_type local_34 [2];
  Register r_local;
  
  local_34[0].r = r.r;
  if (m->mode == Write) {
    pmVar4 = std::
             map<Register,_Hcell,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
             ::operator[](&m->regval,local_34);
    pmVar5 = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
             operator[](&m->heap,&m->h);
    HVar3.hix = (pmVar4->hix_).hix;
    pmVar5->tag = pmVar4->tag;
    pmVar5->hix_ = (Hix)HVar3.hix;
    std::__cxx11::string::_M_assign((string *)&pmVar5->f_);
    (pmVar5->f_).arity = (pmVar4->f_).arity;
    (m->h).hix = (m->h).hix + 1;
  }
  else if (m->mode == Read) {
    std::
    _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
    ::_Rb_tree((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
                *)&local_a8,
               (_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
                *)m);
    std::
    _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
    ::_Rb_tree(&local_a8.regval._M_t,&(m->regval)._M_t);
    local_a8.mode = m->mode;
    local_a8.h.hix = (m->h).hix;
    local_a8.s.hix = (m->s).hix;
    auVar2._4_4_ = 0xffffffd6;
    auVar2._0_4_ = local_34[0].r;
    auVar2._8_4_ = 0;
    a2.hix_.hix = (m->s).hix;
    a2.tag_ = Heap;
    a2.r_.r = -0x2a;
    unify(&local_118,&local_a8,(Addr)(auVar2 << 0x20),a2);
    std::
    _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
    ::clear((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
             *)m);
    if (local_118.heap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      p_Var1 = &local_118.heap._M_t._M_impl.super__Rb_tree_header;
      (m->heap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           local_118.heap._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
      (m->heap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           local_118.heap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      (m->heap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           local_118.heap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (m->heap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_118.heap._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
      (local_118.heap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           &(m->heap)._M_t._M_impl.super__Rb_tree_header._M_header;
      (m->heap)._M_t._M_impl.super__Rb_tree_header._M_node_count =
           local_118.heap._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_118.heap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_118.heap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_118.heap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_118.heap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    }
    std::
    _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
    ::clear(&(m->regval)._M_t);
    if (local_118.regval._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      p_Var1 = &local_118.regval._M_t._M_impl.super__Rb_tree_header;
      (m->regval)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           local_118.regval._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
      (m->regval)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           local_118.regval._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      (m->regval)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           local_118.regval._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (m->regval)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_118.regval._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
      (local_118.regval._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           &(m->regval)._M_t._M_impl.super__Rb_tree_header._M_header;
      (m->regval)._M_t._M_impl.super__Rb_tree_header._M_node_count =
           local_118.regval._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_118.regval._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_118.regval._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_118.regval._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_118.regval._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    }
    m->mode = local_118.mode;
    m->h = (Hix)local_118.h.hix;
    m->s = (Hix)local_118.s.hix;
    std::
    _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
    ::~_Rb_tree(&local_118.regval._M_t);
    std::
    _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
    ::~_Rb_tree((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
                 *)&local_118);
    std::
    _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
    ::~_Rb_tree(&local_a8.regval._M_t);
    std::
    _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
    ::~_Rb_tree((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
                 *)&local_a8);
  }
  (m->s).hix = (m->s).hix + 1;
  std::_Rb_tree_header::_Rb_tree_header
            (&(__return_storage_ptr__->heap)._M_t._M_impl.super__Rb_tree_header,
             &(m->heap)._M_t._M_impl.super__Rb_tree_header);
  std::_Rb_tree_header::_Rb_tree_header
            (&(__return_storage_ptr__->regval)._M_t._M_impl.super__Rb_tree_header,
             &(m->regval)._M_t._M_impl.super__Rb_tree_header);
  __return_storage_ptr__->mode = m->mode;
  HVar3.hix = (m->s).hix;
  __return_storage_ptr__->h = (Hix)(m->h).hix;
  __return_storage_ptr__->s = (Hix)HVar3.hix;
  return __return_storage_ptr__;
}

Assistant:

Machine unifyValue(Machine m, Register r) {
    switch (m.mode) {
        case Mode::Read:
            m = unify(m, r, m.s);
            break;
        case Mode::Write:
            m.heap[m.h] = m.regval[r];
            m.h += 1;
            break;
    }
    m.s += 1;
    return m;
}